

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O1

void __thiscall
google::
sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
::copy_from(sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
            *this,sparse_hashtable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
                  *ht,size_type min_buckets_wanted)

{
  int *piVar1;
  uint *puVar2;
  size_type *psVar3;
  sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
  *this_00;
  ushort uVar4;
  size_type sVar5;
  size_type sVar6;
  pointer psVar7;
  size_type new_size;
  ulong uVar8;
  ulong uVar9;
  const_iterator cVar10;
  size_type sVar11;
  long lVar12;
  ulong uVar13;
  float fVar14;
  float fVar15;
  const_iterator it;
  sparse_hashtable_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
  local_c0;
  const_iterator local_78;
  
  clear(this);
  new_size = sparsehash_internal::
             sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
             ::min_buckets((sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
                            *)this,(ht->table).settings.num_buckets - ht->num_deleted,
                           min_buckets_wanted);
  if ((this->table).settings.table_size < new_size) {
    sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
    ::resize(&this->table,new_size);
    fVar14 = (float)(this->table).settings.table_size;
    fVar15 = (this->settings).
             super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
             .enlarge_factor_ * fVar14;
    uVar8 = (ulong)fVar15;
    (this->settings).
    super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
    .enlarge_threshold_ = (long)(fVar15 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
    fVar14 = fVar14 * (this->settings).
                      super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
                      .shrink_factor_;
    uVar8 = (ulong)fVar14;
    (this->settings).
    super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
    .shrink_threshold_ = (long)(fVar14 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
    (this->settings).
    super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
    .consider_shrink_ = false;
  }
  begin(&local_78,ht);
  do {
    local_c0.pos.row_begin._M_current =
         (ht->table).groups.
         super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_c0.pos.row_end._M_current =
         (ht->table).groups.
         super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_c0.pos.col_current = (const_reference)0x0;
    local_c0.end.col_current = (const_nonempty_iterator)0x0;
    local_c0.ht = ht;
    local_c0.pos.row_current._M_current = local_c0.pos.row_end._M_current;
    local_c0.end.row_begin._M_current = local_c0.pos.row_begin._M_current;
    local_c0.end.row_end._M_current = local_c0.pos.row_end._M_current;
    local_c0.end.row_current._M_current = local_c0.pos.row_end._M_current;
    sparse_hashtable_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
    ::advance_past_deleted(&local_c0);
    if ((((local_78.pos.row_begin._M_current == local_c0.pos.row_begin._M_current) &&
         (local_78.pos.row_end._M_current == local_c0.pos.row_end._M_current)) &&
        (local_78.pos.row_current._M_current == local_c0.pos.row_current._M_current)) &&
       ((local_78.pos.row_current._M_current == local_78.pos.row_end._M_current ||
        (local_78.pos.col_current == local_c0.pos.col_current)))) {
      puVar2 = &(this->settings).
                super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
                .num_ht_copies_;
      *puVar2 = *puVar2 + 1;
      return;
    }
    sVar5 = (this->table).settings.table_size;
    piVar1 = &(this->settings).
              super_sh_hashtable_settings<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_unsigned_long,_4>
              .super_Hasher.num_hashes_;
    *piVar1 = *piVar1 + 1;
    sVar6 = ((local_78.pos.col_current)->first)._M_string_length;
    if (sVar6 == 0) {
      uVar8 = 0;
    }
    else {
      sVar11 = 0;
      uVar8 = 0;
      do {
        uVar8 = (long)((local_78.pos.col_current)->first)._M_dataplus._M_p[sVar11] + uVar8 * 0x21;
        sVar11 = sVar11 + 1;
      } while (sVar6 != sVar11);
    }
    psVar7 = (this->table).groups.
             super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = 0;
    while( true ) {
      uVar8 = uVar8 & sVar5 - 1;
      uVar13 = uVar8 / 0x30;
      uVar9 = uVar8 % 0x30;
      this_00 = psVar7 + uVar13;
      if ((this_00->bitmap[uVar9 >> 3] >> ((uint)uVar9 & 7) & 1) == 0) break;
      uVar8 = uVar8 + lVar12 + 1;
      lVar12 = lVar12 + 1;
    }
    uVar4 = psVar7[uVar13].settings.num_buckets;
    sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
    ::set(this_00,(size_type_conflict)uVar9,local_78.pos.col_current);
    psVar3 = &(this->table).settings.num_buckets;
    *psVar3 = *psVar3 + ((ulong)(this->table).groups.
                                super__Vector_base<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar13].settings.
                                num_buckets - (ulong)uVar4);
    local_78.pos.col_current = local_78.pos.col_current + 1;
    cVar10._M_current = local_78.pos.row_current._M_current;
    if (local_78.pos.col_current ==
        (local_78.pos.row_current._M_current)->group +
        ((local_78.pos.row_current._M_current)->settings).num_buckets) {
      do {
        cVar10._M_current = local_78.pos.row_current._M_current + 1;
        if (cVar10._M_current == local_78.pos.row_end._M_current) break;
        local_78.pos.col_current = (cVar10._M_current)->group;
        psVar7 = local_78.pos.row_current._M_current + 1;
        local_78.pos.row_current._M_current = cVar10._M_current;
      } while ((psVar7->settings).num_buckets == 0);
    }
    local_78.pos.row_current._M_current = cVar10._M_current;
    sparse_hashtable_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Hasher,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SelectKey,_google::sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DenseStringSet>_>_>
    ::advance_past_deleted(&local_78);
  } while( true );
}

Assistant:

void copy_from(const sparse_hashtable& ht, size_type min_buckets_wanted) {
    clear();  // clear table, set num_deleted to 0

    // If we need to change the size of our table, do it now
    const size_type resize_to =
        settings.min_buckets(ht.size(), min_buckets_wanted);
    if (resize_to > bucket_count()) {  // we don't have enough buckets
      table.resize(resize_to);         // sets the number of buckets
      settings.reset_thresholds(bucket_count());
    }

    // We use a normal iterator to get non-deleted bcks from ht
    // We could use insert() here, but since we know there are
    // no duplicates and no deleted items, we can be more efficient
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // a power of two
    for (const_iterator it = ht.begin(); it != ht.end(); ++it) {
      size_type num_probes = 0;  // how many times we've probed
      size_type bucknum;
      const size_type bucket_count_minus_one = bucket_count() - 1;
      for (bucknum = hash(get_key(*it)) & bucket_count_minus_one;
           table.test(bucknum);  // not empty
           bucknum =
               (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one) {
        ++num_probes;
        assert(num_probes < bucket_count() &&
               "Hashtable is full: an error in key_equal<> or hash<>");
      }
      table.set(bucknum, *it);  // copies the value to here
    }
    settings.inc_num_ht_copies();
  }